

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O3

int __thiscall HttpHeaderBase::addFieldMap(HttpHeaderBase *this,FieldMap *fieldMap)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  
  if (fieldMap != (FieldMap *)0x0) {
    pNVar3 = (Node *)operator_new(0x18,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/include/jh_list.h"
                                  ,0xa7);
    pNVar3->val = fieldMap;
    pNVar1 = (this->mFieldMappings).mTail;
    pNVar2 = pNVar1->prev;
    pNVar3->prev = pNVar2;
    pNVar3->next = pNVar1;
    pNVar2->next = pNVar3;
    pNVar1->prev = pNVar3;
    return 0;
  }
  return -1;
}

Assistant:

int HttpHeaderBase::addFieldMap(FieldMap *fieldMap)
{
	TRACE_BEGIN(LOG_LVL_INFO);
	
	if (fieldMap == NULL)
		return -1;
	
	// Currently the assumption is that people adding field maps are doing
	// it in order.  ie.   HTTP->DLNA->DTV and that they want the mappings
	// searched in that order.  So mappings are appended to the tail as they
	// are added.
	mFieldMappings.push_back(fieldMap);
	return 0;
}